

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrPreview(string *tempdir)

{
  exr_result_t eVar1;
  exr_context_t p_Var2;
  void *pvVar3;
  char *pcVar4;
  undefined4 *puVar5;
  ostream *poVar6;
  size_t sVar7;
  char *in_RCX;
  char *pcVar8;
  exr_result_t eVar9;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var2 = createDummyFile("<preview>");
  local_20 = p_Var2;
  if (p_Var2 == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*p_Var2->report_error)(p_Var2,3,"Invalid reference to preview object to initialize");
  }
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(3);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, __null, 64, 64)",(char *)0x328,0x34a3d5,in_RCX);
  }
  if (p_Var2 == (exr_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar8 = (char *)exr_get_default_error_message(2);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_destroy (f, __null)",(char *)0x32b,0x34a3d5,in_RCX);
  }
  pcVar8 = (char *)0xffffffff;
  eVar1 = (*p_Var2->print_error)
                    (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                     0xffffffff,0x40,0xffffffff00);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, (uint32_t) -1, 64)",(char *)0x32e,0x34a3d5,pcVar8)
    ;
  }
  eVar9 = 0;
  pcVar8 = (char *)0x40;
  eVar1 = (*p_Var2->print_error)
                    (p_Var2,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",0x40
                     ,0xffffffff,0xffffffff00);
  if (eVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, 64, (uint32_t) -1)",(char *)0x331,0x34a3d5,pcVar8)
    ;
  }
  pvVar3 = (*p_Var2->alloc_fn)(4);
  if (pvVar3 == (void *)0x0) {
    eVar9 = (*p_Var2->standard_error)(p_Var2,1);
  }
  if (eVar9 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar9);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x332,0x34a3d5,pcVar8);
  }
  if (pvVar3 == (void *)0x0) {
    core_test_fail("p.width == 1",(char *)0x333,0x34a3d5,pcVar8);
  }
  (*p_Var2->free_fn)(pvVar3);
  s_malloc_fail_on = 1;
  pvVar3 = (*p_Var2->alloc_fn)(4);
  eVar1 = 0;
  if (pvVar3 == (void *)0x0) {
    eVar1 = (*p_Var2->standard_error)(p_Var2,1);
  }
  s_malloc_fail_on = 0;
  if (eVar1 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x33d,0x34a3d5,pcVar8);
  }
  pcVar4 = (char *)(*p_Var2->alloc_fn)(4);
  eVar1 = 0;
  if (pcVar4 == (char *)0x0) {
    eVar1 = (*p_Var2->standard_error)(p_Var2,1);
  }
  if (eVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x33f,0x34a3d5,pcVar8);
  }
  pcVar4[0] = -0x22;
  pcVar4[1] = -0x53;
  pcVar4[2] = -0x42;
  pcVar4[3] = -0x11;
  if (pcVar4 == (char *)0x0) {
    core_test_fail("p.width == 1",(char *)0x340,0x34a3d5,pcVar8);
  }
  if (*pcVar4 != -0x22) {
    core_test_fail("p.rgba[0] == 0xDE",(char *)0x344,0x34a3d5,pcVar8);
  }
  if (pcVar4[1] != -0x53) {
    core_test_fail("p.rgba[1] == 0xAD",(char *)0x345,0x34a3d5,pcVar8);
  }
  if (pcVar4[2] != -0x42) {
    core_test_fail("p.rgba[2] == 0xBE",(char *)0x346,0x34a3d5,pcVar8);
  }
  if (pcVar4[3] != -0x11) {
    core_test_fail("p.rgba[3] == 0xEF",(char *)0x347,0x34a3d5,pcVar8);
  }
  (*p_Var2->free_fn)(pcVar4);
  s_malloc_fail_on = 1;
  puVar5 = (undefined4 *)(*p_Var2->alloc_fn)(4);
  eVar1 = 0;
  if (puVar5 == (undefined4 *)0x0) {
    eVar1 = (*p_Var2->standard_error)(p_Var2,1);
  }
  if (eVar1 == 0) {
    *puVar5 = 0xefbeadde;
  }
  s_malloc_fail_on = 0;
  if (eVar1 == 1) {
    exr_print_context_info(local_20,0);
    exr_print_context_info(local_20,1);
    exr_finish(&local_20);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
  pcVar4 = (char *)exr_get_default_error_message(eVar1);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
  pcVar4 = (char *)exr_get_default_error_message(1);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x34d,0x34a3d5,pcVar8);
}

Assistant:

void
testAttrPreview (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testPreviewHelper (NULL);
    exr_context_t f = createDummyFile ("<preview>");
    testPreviewHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}